

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::operator*=(Matrix *this,Permutation *permutation)

{
  Permutation local_30;
  Permutation *local_18;
  Permutation *permutation_local;
  Matrix *this_local;
  
  local_18 = permutation;
  permutation_local = (Permutation *)this;
  Permutation::GetInverse(&local_30,permutation);
  ApplyColumnPermutation(this,&local_30);
  Permutation::~Permutation(&local_30);
  return this;
}

Assistant:

Matrix& Matrix::operator*=(const Permutation& permutation) {
  ApplyColumnPermutation(permutation.GetInverse());
  return *this;
}